

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::EmissionSystem::operator==(EmissionSystem *this,EmissionSystem *Value)

{
  KBOOL KVar1;
  bool bVar2;
  EmissionSystem *Value_local;
  EmissionSystem *this_local;
  
  if (this->m_ui8SystemDataLength == Value->m_ui8SystemDataLength) {
    if (this->m_ui8NumberOfBeams == Value->m_ui8NumberOfBeams) {
      KVar1 = EmitterSystem::operator!=(&this->m_EmitterSystemRecord,&Value->m_EmitterSystemRecord);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        KVar1 = Vector::operator!=(&this->m_Location,&Value->m_Location);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          bVar2 = std::operator!=(&this->m_vEmitterBeams,&Value->m_vEmitterBeams);
          if (bVar2) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL EmissionSystem::operator == ( const EmissionSystem & Value ) const
{
    if( m_ui8SystemDataLength   != Value.m_ui8SystemDataLength )    return false;
    if( m_ui8NumberOfBeams      != Value.m_ui8NumberOfBeams )       return false;
    if( m_EmitterSystemRecord   != Value.m_EmitterSystemRecord )    return false;
    if( m_Location              != Value.m_Location )               return false;
    if( m_vEmitterBeams         != Value.m_vEmitterBeams )          return false;
    return true;
}